

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
* getPluckerCoord<double>
            (vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             *__return_storage_ptr__,
            pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
            *lPair)

{
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *pMVar1;
  EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *pEVar2;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other_00;
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *this;
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_428 [56];
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_3f0 [56];
  undefined1 local_3b8 [8];
  Matrix<double,_6,_1,_0,_6,_1> l2;
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_350 [56];
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_318 [8];
  Matrix<double,_6,_1,_0,_6,_1> l1;
  Matrix<double,_3,_1,_0,_3,_1> m2;
  Matrix<double,3,1,0,3,1> local_298 [8];
  Matrix<double,_3,_1,_0,_3,_1> p2;
  Matrix<double,_3,_1,_0,_3,_1> m1;
  Matrix<double,3,1,0,3,1> local_230 [8];
  Matrix<double,_3,_1,_0,_3,_1> p1;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_1e0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>
  local_1a8;
  Matrix<double,3,1,0,3,1> local_130 [8];
  Matrix<double,_3,_1,_0,_3,_1> dir2;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_e0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>
  local_a8;
  Matrix<double,3,1,0,3,1> local_30 [8];
  Matrix<double,_3,_1,_0,_3,_1> dir1;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  *lPair_local;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  *lines;
  
  dir1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)lPair;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)local_e0,
             (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(lPair->first).second,3);
  pMVar1 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
           (dir2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           + 2);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)pMVar1,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)lPair,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator-
            (&local_a8,local_e0,pMVar1);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const>>
            (local_30,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                       *)&local_a8);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)local_1e0,
             (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(lPair->second).second,3);
  pMVar1 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
           (p1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           2);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)pMVar1,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&lPair->second,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator-
            (&local_1a8,local_1e0,pMVar1);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const>>
            (local_130,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&local_1a8);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_30);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_130);
  pEVar2 = (EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
           (m1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           2);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)pEVar2,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)lPair,3);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>>
            (local_230,pEVar2);
  other = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
          (p2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
          2);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((type *)other,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_30,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_230);
  pEVar2 = (EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
           (m2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           2);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)pEVar2,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&lPair->second,3);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>>
            (local_298,pEVar2);
  other_00 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (l1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 5);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((type *)other_00,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_130,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_298);
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_318);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_350,local_318,3);
  Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
            (local_350,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_30);
  this = (Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)
         (l2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 5
         );
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>((Type *)this,local_318,3);
  Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=(this,other);
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_3b8);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)local_3f0,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_3b8,3);
  Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
            (local_3f0,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_130);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
            ((Type *)local_428,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_3b8,3);
  Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=(local_428,other_00);
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_318);
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_3b8);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 6,1>> getPluckerCoord(std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> lPair){

	// get line normalized direction
	Eigen::Matrix<floatPrec,3,1> dir1 = lPair.first.second.head(3) - lPair.first.first.head(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lPair.second.second.head(3) - lPair.second.first.head(3);
	dir1.normalize();
	dir2.normalize();
	// get moment vectors
	Eigen::Matrix<floatPrec,3,1> p1 = lPair.first.first.head(3);
	Eigen::Matrix<floatPrec,3,1> m1 = dir1.cross(p1);
	Eigen::Matrix<floatPrec,3,1> p2 = lPair.second.first.head(3);
	Eigen::Matrix<floatPrec,3,1> m2 = dir2.cross(p2);
	// get plucker coordinates
	Eigen::Matrix<floatPrec,6,1> l1;
	l1.head(3) = dir1; l1.tail(3) = m1;
	Eigen::Matrix<floatPrec,6,1> l2;
	l2.head(3) = dir2; l2.tail(3) = m2;

	vector<Matrix<floatPrec, 6,1>> lines;
	lines.push_back(l1); lines.push_back(l2);

	return lines;
}